

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANTLRException.hpp
# Opt level: O2

void __thiscall antlr::ANTLRException::~ANTLRException(ANTLRException *this)

{
  this->_vptr_ANTLRException = (_func_int **)&PTR__ANTLRException_002c62c8;
  std::__cxx11::string::~string((string *)&this->text);
  return;
}

Assistant:

virtual ~ANTLRException() throw()
	{
	}